

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  u8 uVar1;
  u32 uVar2;
  sqlite3_mutex *psVar3;
  BtShared *pBVar4;
  BtShared *pBVar5;
  Pager *pPVar6;
  bool bVar7;
  DbPage *pDVar8;
  sqlite3_file *psVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  Pgno PVar13;
  Btree *pBVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  DbPage *pSrcPg;
  long local_60;
  Pager *local_58;
  u32 local_4c;
  sqlite3_file *local_48;
  ulong local_40;
  Pager *local_38;
  
  psVar3 = p->pSrcDb->mutex;
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  sqlite3BtreeEnter(p->pSrc);
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar3 = p->pDestDb->mutex, psVar3 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  uVar12 = p->rc;
  if ((6 < uVar12) || ((0x61U >> (uVar12 & 0x1f) & 1) == 0)) goto LAB_00118e46;
  pBVar14 = p->pSrc;
  local_38 = pBVar14->pBt->pPager;
  local_58 = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar14->pBt->inTransaction != '\x02')) {
    if (p->bDestLocked == 0) {
      uVar12 = sqlite3BtreeBeginTrans(p->pDest,2);
      if (uVar12 != 0) goto LAB_00118a67;
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest,1,&p->iDestSchema);
      pBVar14 = p->pSrc;
    }
    if (pBVar14->inTrans != '\0') {
      uVar12 = 0;
      goto LAB_00118a67;
    }
    bVar7 = false;
    uVar12 = sqlite3BtreeBeginTrans(pBVar14,0);
  }
  else {
    uVar12 = 5;
LAB_00118a67:
    bVar7 = true;
  }
  pBVar4 = p->pSrc->pBt;
  uVar2 = pBVar4->pageSize;
  local_40 = (ulong)(int)uVar2;
  pBVar5 = p->pDest->pBt;
  local_4c = pBVar5->pageSize;
  uVar1 = pBVar5->pPager->journalMode;
  local_60 = CONCAT71(local_60._1_7_,uVar1);
  uVar11 = (uint)(uVar2 != local_4c) << 3;
  if (uVar1 != '\x05') {
    uVar11 = uVar12;
  }
  if (uVar12 != 0) {
    uVar11 = uVar12;
  }
  uVar12 = pBVar4->nPage;
  iVar15 = 0;
  local_48 = (sqlite3_file *)CONCAT44(local_48._4_4_,nPage);
  while (((iVar15 < nPage || nPage < 0 && (PVar13 = p->iNext, PVar13 <= uVar12)) && (uVar11 == 0)))
  {
    uVar11 = 0;
    if (PVar13 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
      uVar11 = sqlite3PagerAcquire(local_38,PVar13,&pSrcPg,2);
      pDVar8 = pSrcPg;
      if (uVar11 == 0) {
        uVar11 = backupOnePage(p,PVar13,(u8 *)pSrcPg->pData,0);
        nPage = (int)local_48;
        sqlite3PagerUnref(pDVar8);
      }
      PVar13 = p->iNext;
    }
    p->iNext = PVar13 + 1;
    iVar15 = iVar15 + 1;
  }
  if (uVar11 == 0x65) {
LAB_00118b6e:
    if (uVar12 == 0) {
      pBVar14 = p->pDest;
      sqlite3BtreeEnter(pBVar14);
      pBVar4 = pBVar14->pBt;
      pBVar4->nPage = 0;
      uVar11 = newDatabase(pBVar4);
      sqlite3BtreeLeave(pBVar14);
      uVar12 = 1;
      if ((uVar11 != 0x65) && (uVar11 != 0)) goto LAB_00118e16;
    }
    uVar11 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar11 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if (((char)local_60 != '\x05') || (uVar11 = sqlite3BtreeSetVersion(p->pDest,2), uVar11 == 0))
      {
        iVar15 = (int)local_40;
        if (iVar15 < (int)local_4c) {
          iVar15 = (int)(uVar12 + (int)local_4c / iVar15 + -1) / ((int)local_4c / iVar15);
          uVar11 = 0;
          local_60 = (long)(int)uVar12;
          local_48 = local_58->fd;
          uVar12 = local_58->dbSize;
          for (PVar13 = iVar15 - (uint)(iVar15 ==
                                       (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1);
              (uVar11 == 0 && (PVar13 <= uVar12)); PVar13 = PVar13 + 1) {
            uVar11 = 0;
            if ((PVar13 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) &&
               (uVar11 = sqlite3PagerAcquire(local_58,PVar13,&pSrcPg,0), pDVar8 = pSrcPg,
               uVar11 == 0)) {
              uVar11 = sqlite3PagerWrite(pSrcPg);
              sqlite3PagerUnref(pDVar8);
            }
          }
          lVar18 = local_60 * local_40;
          if (uVar11 == 0) {
            uVar11 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,1);
          }
          uVar10 = local_40;
          lVar17 = (long)(int)(local_4c + sqlite3PendingByte);
          if (lVar18 < (int)(local_4c + sqlite3PendingByte)) {
            lVar17 = lVar18;
          }
          iVar15 = (int)local_40;
          local_60 = lVar18;
          for (lVar16 = (long)(sqlite3PendingByte + iVar15);
              (psVar9 = local_48, uVar11 == 0 && (lVar16 < lVar17)); lVar16 = lVar16 + uVar10) {
            pSrcPg = (DbPage *)0x0;
            uVar11 = sqlite3PagerAcquire(local_38,(int)(lVar16 / (long)uVar10) + 1,&pSrcPg,0);
            pDVar8 = pSrcPg;
            if (uVar11 == 0) {
              uVar11 = (*local_48->pMethods->xWrite)(local_48,pSrcPg->pData,iVar15,lVar16);
            }
            sqlite3PagerUnref(pDVar8);
          }
          if (((uVar11 != 0) ||
              (uVar11 = (*local_48->pMethods->xFileSize)(local_48,(sqlite3_int64 *)&pSrcPg),
              uVar11 != 0)) ||
             ((local_60 < (long)pSrcPg &&
              (uVar11 = (*psVar9->pMethods->xTruncate)(psVar9,local_60), uVar11 != 0))))
          goto LAB_00118e16;
          uVar11 = sqlite3PagerSync(local_58);
        }
        else {
          local_58->dbSize =
               (int)((long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | local_40 & 0xffffffff) /
                    (long)(int)local_4c) * uVar12;
          uVar11 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,0);
        }
        if (uVar11 == 0) {
          uVar12 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar11 = 0x65;
          if (uVar12 != 0) {
            uVar11 = uVar12;
          }
        }
      }
    }
  }
  else if (uVar11 == 0) {
    p->nPagecount = uVar12;
    p->nRemaining = (uVar12 - p->iNext) + 1;
    if (uVar12 < p->iNext) goto LAB_00118b6e;
    uVar11 = 0;
    if (p->isAttached == 0) {
      pPVar6 = p->pSrc->pBt->pPager;
      p->pNext = pPVar6->pBackup;
      pPVar6->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_00118e16:
  if (!bVar7) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar12 = 7;
  if (uVar11 != 0xc0a) {
    uVar12 = uVar11;
  }
  p->rc = uVar12;
LAB_00118e46:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar3 = p->pDestDb->mutex, psVar3 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  sqlite3BtreeLeave(p->pSrc);
  psVar3 = p->pSrcDb->mutex;
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return uVar12;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2)) 
    ){
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest, BTREE_SCHEMA_VERSION, &p->iDestSchema);
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && 0==sqlite3BtreeIsInReadTrans(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0);
      bCloseTrans = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc && destMode==PAGER_JOURNALMODE_WAL && pgszSrc!=pgszDest ){
      rc = SQLITE_READONLY;
    }
  
    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerAcquire(pSrcPager, iSrcPg, &pSrcPg,
                                 PAGER_ACQUIRE_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }
  
    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size. 
        **
        ** If the source page size is smaller than the destination page size, 
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the 
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the 
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0 
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the 
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc; 
            rc==SQLITE_OK && iOff<iEnd; 
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }
    
        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }
  
    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }
  
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}